

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Excluded s2pred::GetVoronoiSiteExclusion
                   (S2Point *a,S2Point *b,S2Point *x0,S2Point *x1,S1ChordAngle r)

{
  s2pred *x1_00;
  S2Point *pSVar1;
  S2Point *b_00;
  S2Point *a_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  S1ChordAngle *this;
  longdouble in_ST0;
  double dVar5;
  ExactFloat local_2a8;
  Vector3_xf local_298;
  Vector3_xf local_268;
  Vector3_xf local_238;
  Vector3_xf local_208;
  Vector3_ld local_1d8;
  Vector3_ld local_1a8;
  Vector3_ld local_178;
  Vector3_ld local_148;
  Excluded local_118;
  byte local_111;
  Excluded result;
  S2LogMessageVoidify local_f9;
  D local_f8;
  byte local_d9;
  S2LogMessage local_d8;
  S2LogMessageVoidify local_c1;
  S2Point *local_c0;
  byte local_b1;
  S2LogMessage local_b0;
  S2LogMessageVoidify local_99;
  S2Point *local_98;
  byte local_89;
  S2LogMessage local_88;
  S2LogMessageVoidify local_75 [20];
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_49;
  double local_48;
  S1ChordAngle local_40;
  s2pred *local_38;
  S2Point *x1_local;
  S2Point *x0_local;
  S2Point *b_local;
  S2Point *a_local;
  S1ChordAngle r_local;
  
  local_40.length2_ = r.length2_;
  local_38 = (s2pred *)x1;
  x1_local = x0;
  x0_local = b;
  b_local = a;
  a_local = (S2Point *)r.length2_;
  local_48 = (double)S1ChordAngle::Right();
  bVar2 = ::operator<(local_40,(S1ChordAngle)local_48);
  local_61 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    x1 = (S2Point *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56b,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar4 = S2LogMessage::stream(&local_60);
    poVar4 = std::operator<<(poVar4,"Check failed: (r) < (S1ChordAngle::Right()) ");
    S2LogMessageVoidify::operator&(&local_49,poVar4);
  }
  if ((local_61 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  iVar3 = CompareDistances((s2pred *)x1_local,b_local,x0_local,x1);
  local_89 = 0;
  if (-1 < iVar3) {
    x1 = (S2Point *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56c,kFatal,(ostream *)&std::cerr);
    local_89 = 1;
    poVar4 = S2LogMessage::stream(&local_88);
    poVar4 = std::operator<<(poVar4,"Check failed: (s2pred::CompareDistances(x0, a, b)) < (0) ");
    S2LogMessageVoidify::operator&(local_75,poVar4);
  }
  if ((local_89 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_88);
  }
  local_98 = a_local;
  iVar3 = CompareEdgeDistance(b_local,x1_local,(S2Point *)local_38,(S1ChordAngle)a_local);
  local_b1 = 0;
  if (0 < iVar3) {
    x1 = (S2Point *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56d,kFatal,(ostream *)&std::cerr);
    local_b1 = 1;
    poVar4 = S2LogMessage::stream(&local_b0);
    poVar4 = std::operator<<(poVar4,
                             "Check failed: (s2pred::CompareEdgeDistance(a, x0, x1, r)) <= (0) ");
    S2LogMessageVoidify::operator&(&local_99,poVar4);
  }
  if ((local_b1 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b0);
  }
  local_c0 = a_local;
  iVar3 = CompareEdgeDistance(x0_local,x1_local,(S2Point *)local_38,(S1ChordAngle)a_local);
  local_d9 = 0;
  if (0 < iVar3) {
    x1 = (S2Point *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56e,kFatal,(ostream *)&std::cerr);
    local_d9 = 1;
    poVar4 = S2LogMessage::stream(&local_d8);
    poVar4 = std::operator<<(poVar4,
                             "Check failed: (s2pred::CompareEdgeDistance(b, x0, x1, r)) <= (0) ");
    S2LogMessageVoidify::operator&(&local_c1,poVar4);
  }
  pSVar1 = x1_local;
  if ((local_d9 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d8);
  }
  util::math::internal_vector::operator-(&local_f8,(D *)local_38);
  bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)pSVar1,&local_f8);
  local_111 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    x1 = (S2Point *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&result,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x571,kFatal,(ostream *)&std::cerr);
    local_111 = 1;
    poVar4 = S2LogMessage::stream((S2LogMessage *)&result);
    poVar4 = std::operator<<(poVar4,"Check failed: (x0) != (-x1) ");
    S2LogMessageVoidify::operator&(&local_f9,poVar4);
  }
  if ((local_111 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&result);
  }
  iVar3 = CompareDistances(local_38,b_local,x0_local,x1);
  a_00 = b_local;
  b_00 = x0_local;
  pSVar1 = x1_local;
  x1_00 = local_38;
  if (iVar3 < 0) {
    r_local.length2_._4_4_ = SECOND;
  }
  else {
    dVar5 = S1ChordAngle::length2((S1ChordAngle *)&a_local);
    local_118 = TriageVoronoiSiteExclusion<double>(a_00,b_00,pSVar1,(Vector3<double> *)x1_00,dVar5);
    r_local.length2_._4_4_ = local_118;
    if (local_118 == UNCERTAIN) {
      ToLD(&local_148,b_local);
      ToLD(&local_178,x0_local);
      ToLD(&local_1a8,x1_local);
      ToLD(&local_1d8,(S2Point *)local_38);
      this = (S1ChordAngle *)&a_local;
      dVar5 = S1ChordAngle::length2(this);
      ToLD((longdouble *)this,dVar5);
      local_118 = TriageVoronoiSiteExclusion<long_double>
                            (&local_148,&local_178,&local_1a8,&local_1d8,in_ST0);
      r_local.length2_._4_4_ = local_118;
      if (local_118 == UNCERTAIN) {
        ToExact(&local_208,b_local);
        ToExact(&local_238,x0_local);
        ToExact(&local_268,x1_local);
        ToExact(&local_298,(S2Point *)local_38);
        dVar5 = S1ChordAngle::length2((S1ChordAngle *)&a_local);
        ExactFloat::ExactFloat(&local_2a8,dVar5);
        r_local.length2_._4_4_ =
             ExactVoronoiSiteExclusion(&local_208,&local_238,&local_268,&local_298,&local_2a8);
        ExactFloat::~ExactFloat(&local_2a8);
        Vector3<ExactFloat>::~Vector3(&local_298);
        Vector3<ExactFloat>::~Vector3(&local_268);
        Vector3<ExactFloat>::~Vector3(&local_238);
        Vector3<ExactFloat>::~Vector3(&local_208);
      }
    }
  }
  return r_local.length2_._4_4_;
}

Assistant:

Excluded GetVoronoiSiteExclusion(const S2Point& a, const S2Point& b,
                                 const S2Point& x0, const S2Point& x1,
                                 S1ChordAngle r) {
  S2_DCHECK_LT(r, S1ChordAngle::Right());
  S2_DCHECK_LT(s2pred::CompareDistances(x0, a, b), 0);  // (implies a != b)
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(a, x0, x1, r), 0);
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(b, x0, x1, r), 0);
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactVoronoiSiteExclusion.)
  S2_DCHECK_NE(x0, -x1);

  // If one site is closer than the other to both endpoints of X, then it is
  // closer to every point on X.  Note that this also handles the case where A
  // and B are equidistant from every point on X (i.e., X is the perpendicular
  // bisector of AB), because CompareDistances uses symbolic perturbations to
  // ensure that either A or B is considered closer (in a consistent way).
  // This also ensures that the choice of A or B does not depend on the
  // direction of X.
  if (s2pred::CompareDistances(x1, a, b) < 0) {
    return Excluded::SECOND;  // Site A is closer to every point on X.
  }

  Excluded result = TriageVoronoiSiteExclusion(a, b, x0, x1, r.length2());
  if (result != Excluded::UNCERTAIN) return result;

  result = TriageVoronoiSiteExclusion(ToLD(a), ToLD(b), ToLD(x0), ToLD(x1),
                                      ToLD(r.length2()));
  if (result != Excluded::UNCERTAIN) return result;

  return ExactVoronoiSiteExclusion(ToExact(a), ToExact(b), ToExact(x0),
                                   ToExact(x1), r.length2());
}